

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::BlenderModifierShowcase::ApplyModifiers
          (BlenderModifierShowcase *this,aiNode *out,ConversionData *conv_data,Scene *in,
          Object *orig_object)

{
  FileDatabase *pFVar1;
  BlenderModifier *pBVar2;
  bool bVar3;
  int iVar4;
  Structure *pSVar5;
  Field *pFVar6;
  Logger *pLVar7;
  fpCreateModifier *pp_Var8;
  element_type *peVar9;
  char *message;
  long lVar10;
  pointer ppBVar11;
  pointer ppBVar12;
  char *local_1d8 [4];
  aiNode *local_1b8;
  Scene *local_1b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  peVar9 = (element_type *)&(orig_object->modifiers).first;
  lVar10 = 0;
  local_1b8 = out;
  local_1b0 = in;
  do {
    peVar9 = ((__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2> *)
             &peVar9->_vptr_ElemBase)->_M_ptr;
    if (peVar9 == (element_type *)0x0) {
      if (lVar10 != 0) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[35]>(&local_1a8,(char (*) [35])"BlendModifier: found handlers for ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        ::std::operator<<((ostream *)&local_1a8," of ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        ::std::operator<<((ostream *)&local_1a8," modifiers on `");
        ::std::operator<<((ostream *)&local_1a8,(orig_object->id).name);
        ::std::operator<<((ostream *)&local_1a8,"`, check log messages above for errors");
        ::std::__cxx11::stringbuf::str();
        Logger::debug(pLVar7,local_1d8[0]);
        ::std::__cxx11::string::~string((string *)local_1d8);
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      return;
    }
    if (peVar9->dna_type == (char *)0x0) {
      __assert_fail("cur->dna_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                    ,0x5a,
                    "void Assimp::Blender::BlenderModifierShowcase::ApplyModifiers(aiNode &, ConversionData &, const Scene &, const Object &)"
                   );
    }
    pFVar1 = conv_data->db;
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,peVar9->dna_type,(allocator<char> *)local_1d8);
    pSVar5 = DNA::Get(&pFVar1->dna,(string *)&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    if (pSVar5 == (Structure *)0x0) {
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[44]>
                (&local_1a8,(char (*) [44])"BlendModifier: could not resolve DNA name: ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                 &peVar9->dna_type);
      ::std::__cxx11::stringbuf::str();
      Logger::warn(pLVar7,local_1d8[0]);
LAB_004855d3:
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"modifier",(allocator<char> *)local_1d8);
      pFVar6 = Structure::Get(pSVar5,(string *)&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      if ((pFVar6 == (Field *)0x0) || (pFVar6->offset != 0)) {
        pLVar7 = DefaultLogger::get();
        message = "BlendModifier: expected a `modifier` member at offset 0";
      }
      else {
        pSVar5 = DNA::Get(&conv_data->db->dna,&pFVar6->type);
        if (pSVar5 != (Structure *)0x0) {
          bVar3 = ::std::operator!=(&pSVar5->name,"ModifierData");
          if (!bVar3) {
            ppBVar11 = (this->cached_modifiers).arr.
                       super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppBVar12 = (this->cached_modifiers).arr.
                       super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (pp_Var8 = creators; *pp_Var8 != (fpCreateModifier)0x0; pp_Var8 = pp_Var8 + 1) {
              if (ppBVar11 == ppBVar12) {
                local_1a8._0_8_ = (**pp_Var8)();
                ::std::
                vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
                ::emplace_back<Assimp::Blender::BlenderModifier*>
                          ((vector<Assimp::Blender::BlenderModifier*,std::allocator<Assimp::Blender::BlenderModifier*>>
                            *)this,(BlenderModifier **)&local_1a8);
                ppBVar12 = (this->cached_modifiers).arr.
                           super__Vector_base<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                ppBVar11 = ppBVar12 + -1;
              }
              pBVar2 = *ppBVar11;
              iVar4 = (*pBVar2->_vptr_BlenderModifier[2])(pBVar2,peVar9 + 1);
              if ((char)iVar4 != '\0') {
                (*pBVar2->_vptr_BlenderModifier[3])
                          (pBVar2,local_1b8,conv_data,peVar9,local_1b0,orig_object);
                goto LAB_004855e3;
              }
              ppBVar11 = ppBVar11 + 1;
            }
            pLVar7 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[39]>
                      (&local_1a8,(char (*) [39])"Couldn\'t find a handler for modifier: ");
            ::std::operator<<((ostream *)&local_1a8,(char *)&peVar9[4].dna_type);
            ::std::__cxx11::stringbuf::str();
            Logger::warn(pLVar7,local_1d8[0]);
            goto LAB_004855d3;
          }
        }
        pLVar7 = DefaultLogger::get();
        message = "BlendModifier: expected a ModifierData structure as first member";
      }
      Logger::warn(pLVar7,message);
    }
LAB_004855e3:
    peVar9 = peVar9 + 2;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void BlenderModifierShowcase::ApplyModifiers(aiNode& out, ConversionData& conv_data, const Scene& in, const Object& orig_object )
{
    size_t cnt = 0u, ful = 0u;

    // NOTE: this cast is potentially unsafe by design, so we need to perform type checks before
    // we're allowed to dereference the pointers without risking to crash. We might still be
    // invoking UB btw - we're assuming that the ModifierData member of the respective modifier
    // structures is at offset sizeof(vftable) with no padding.
    const SharedModifierData* cur = static_cast<const SharedModifierData *> ( orig_object.modifiers.first.get() );
    for (; cur; cur =  static_cast<const SharedModifierData *> ( cur->modifier.next.get() ), ++ful) {
        ai_assert(cur->dna_type);

        const Structure* s = conv_data.db.dna.Get( cur->dna_type );
        if (!s) {
            ASSIMP_LOG_WARN_F("BlendModifier: could not resolve DNA name: ",cur->dna_type);
            continue;
        }

        // this is a common trait of all XXXMirrorData structures in BlenderDNA
        const Field* f = s->Get("modifier");
        if (!f || f->offset != 0) {
            ASSIMP_LOG_WARN("BlendModifier: expected a `modifier` member at offset 0");
            continue;
        }

        s = conv_data.db.dna.Get( f->type );
        if (!s || s->name != "ModifierData") {
            ASSIMP_LOG_WARN("BlendModifier: expected a ModifierData structure as first member");
            continue;
        }

        // now, we can be sure that we should be fine to dereference *cur* as
        // ModifierData (with the above note).
        const ModifierData& dat = cur->modifier;

        const fpCreateModifier* curgod = creators;
        std::vector< BlenderModifier* >::iterator curmod = cached_modifiers->begin(), endmod = cached_modifiers->end();

        for (;*curgod;++curgod,++curmod) { // allocate modifiers on the fly
            if (curmod == endmod) {
                cached_modifiers->push_back((*curgod)());

                endmod = cached_modifiers->end();
                curmod = endmod-1;
            }

            BlenderModifier* const modifier = *curmod;
            if(modifier->IsActive(dat)) {
                modifier->DoIt(out,conv_data,*static_cast<const ElemBase *>(cur),in,orig_object);
                cnt++;

                curgod = NULL;
                break;
            }
        }
        if (curgod) {
            ASSIMP_LOG_WARN_F("Couldn't find a handler for modifier: ",dat.name);
        }
    }

    // Even though we managed to resolve some or all of the modifiers on this
    // object, we still can't say whether our modifier implementations were
    // able to fully do their job.
    if (ful) {
        ASSIMP_LOG_DEBUG_F("BlendModifier: found handlers for ",cnt," of ",ful," modifiers on `",orig_object.id.name,
            "`, check log messages above for errors");
    }
}